

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void __thiscall
JsonArray_NestedError_Test::~JsonArray_NestedError_Test(JsonArray_NestedError_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonArray).super_Test._vptr_Test = (_func_int **)&PTR__JsonArray_001bd888;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonArray).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, NestedError) {
    {
        json::parser<json_out_callbacks> p;
        p.input ("[[no"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::unrecognized_token));
    }
    {
        json::parser<json_out_callbacks> p;
        p.input ("[[null"s);
        p.eof ();
        EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_array_member));
    }
}